

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

message * lscpp::experimental::parse_request(message *__return_storage_ptr__,string *request)

{
  mapped_type mVar1;
  reference this;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  mapped_type local_58;
  mapped_type method;
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  local_48;
  undefined1 local_28 [8];
  json j;
  string *request_local;
  
  j.m_value = (json_value)request;
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::function(&local_48,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_28,request,&local_48,true,false);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_48);
  this = nlohmann::json_abi_v3_11_2::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_28,"method");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_78,this);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lscpp::experimental::method_kind>_>_>
                 *)(anonymous_namespace)::method_str_to_kind_abi_cxx11_,&local_78);
  mVar1 = *pmVar2;
  std::__cxx11::string::~string((string *)&local_78);
  local_58 = mVar1;
  if (mVar1 == INITIALIZE) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)0>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == INITIALIZED) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)1>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == EXIT) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)2>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == SHUTDOWN) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)3>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_HOVER) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)8>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_DEFINITION) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)9>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_COMPLETION) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)10>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_DIAGNOSTIC) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)11>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_DID_OPEN) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)4>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_DID_CHANGE) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)5>
              (__return_storage_ptr__,(json *)local_28);
  }
  else if (mVar1 == TEXT_DOCUMENT_DID_CLOSE) {
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)6>
              (__return_storage_ptr__,(json *)local_28);
  }
  else {
    if (mVar1 != TEXT_DOCUMENT_DID_SAVE) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/experimental/messages.cpp"
                    ,0x7c,"message lscpp::experimental::parse_request(std::string)");
    }
    anon_unknown_0::as_message<(lscpp::experimental::method_kind)7>
              (__return_storage_ptr__,(json *)local_28);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_28);
  return __return_storage_ptr__;
}

Assistant:

message parse_request(std::string request) {
  nlohmann::json j = nlohmann::json::parse(request);
  const auto method = method_str_to_kind.at(j["method"]);

  // TODO fix this pattern
  if (method == method_kind::INITIALIZE) {
    return as_message<method_kind::INITIALIZE>(j);
  } else if (method == method_kind::INITIALIZED) {
    return as_message<method_kind::INITIALIZED>(j);
  } else if (method == method_kind::EXIT) {
    return as_message<method_kind::EXIT>(j);
  } else if (method == method_kind::SHUTDOWN) {
    return as_message<method_kind::SHUTDOWN>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_HOVER) {
    return as_message<method_kind::TEXT_DOCUMENT_HOVER>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DEFINITION) {
    return as_message<method_kind::TEXT_DOCUMENT_DEFINITION>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_COMPLETION) {
    return as_message<method_kind::TEXT_DOCUMENT_COMPLETION>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DIAGNOSTIC) {
    return as_message<method_kind::TEXT_DOCUMENT_DIAGNOSTIC>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_OPEN) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_OPEN>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_CHANGE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_CHANGE>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_CLOSE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_CLOSE>(j);
  } else if (method == method_kind::TEXT_DOCUMENT_DID_SAVE) {
    return as_message<method_kind::TEXT_DOCUMENT_DID_SAVE>(j);
    // } else if (method == "textDocument/willSave") {
    //   TODO
  }
  assert(false); // unreachable
}